

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

void Vec_WrdDoubleSimInfo(Vec_Wrd_t *p,int nObjs)

{
  word *pwVar1;
  int iVar2;
  ulong uVar3;
  size_t __n;
  long lVar4;
  int iVar5;
  bool bVar6;
  
  iVar2 = p->nSize;
  pwVar1 = (word *)calloc((long)iVar2 * 2,8);
  if (iVar2 % nObjs == 0) {
    iVar5 = (iVar2 / nObjs) * 2;
    __n = (long)(iVar2 / nObjs) * 8;
    lVar4 = 0;
    uVar3 = 0;
    if (0 < nObjs) {
      uVar3 = (ulong)(uint)nObjs;
    }
    iVar2 = 0;
    while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
      memcpy(pwVar1 + iVar2,(void *)((long)p->pArray + lVar4),__n);
      iVar2 = iVar2 + iVar5;
      lVar4 = lVar4 + __n;
    }
    free(p->pArray);
    p->pArray = pwVar1;
    iVar5 = iVar5 * nObjs;
    p->nCap = iVar5;
    p->nSize = iVar5;
    return;
  }
  __assert_fail("Vec_WrdSize(p) % nObjs == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSim.c"
                ,0x7b,"void Vec_WrdDoubleSimInfo(Vec_Wrd_t *, int)");
}

Assistant:

void Vec_WrdDoubleSimInfo( Vec_Wrd_t * p, int nObjs )
{
    word * pArray = ABC_CALLOC( word, 2 * Vec_WrdSize(p) );
    int i, nWords = Vec_WrdSize(p) / nObjs;
    assert( Vec_WrdSize(p) % nObjs == 0 );
    for ( i = 0; i < nObjs; i++ )
        memcpy( pArray + 2*i*nWords, p->pArray + i*nWords, sizeof(word) * nWords );
    ABC_FREE( p->pArray ); p->pArray = pArray;
    p->nSize = p->nCap = 2*nWords*nObjs;
}